

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

bool SoapySDRDevice_getDCOffsetMode(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  uVar1 = (**(code **)(*(long *)device + 0x100))(device,direction,channel);
  return (bool)uVar1;
}

Assistant:

bool SoapySDRDevice_getDCOffsetMode(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return device->getDCOffsetMode(direction, channel);
    __SOAPY_SDR_C_CATCH_RET(SoapySDRBoolErr);
}